

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

uint cio_write(opj_cio_t *cio,unsigned_long_long v,int n)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar3 = (ulong)(uint)n * 8;
    lVar2 = (ulong)(uint)n + 1;
    do {
      lVar3 = lVar3 + -8;
      puVar1 = cio->bp;
      if (cio->end <= puVar1) {
        opj_event_msg(cio->cinfo,1,"write error\n");
        return 0;
      }
      cio->bp = puVar1 + 1;
      *puVar1 = (uchar)(v >> ((byte)lVar3 & 0x3f));
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return n;
}

Assistant:

unsigned int cio_write(opj_cio_t *cio, unsigned long long int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		if( !cio_byteout(cio, (unsigned char) ((v >> (i << 3)) & 0xff)) )
			return 0;
	}
	return n;
}